

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool wallet::AddWallet(WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  shared_ptr<wallet::CWallet> *psVar1;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  _Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(context->wallets_mutex).super_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  if ((wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("wallet",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x98,"bool wallet::AddWallet(WalletContext &, const std::shared_ptr<CWallet> &)")
    ;
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<wallet::CWallet>*,std::vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<wallet::CWallet>const>>
                    ((context->wallets).
                     super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (context->wallets).
                     super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,wallet);
  psVar1 = (context->wallets).
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == psVar1) {
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    push_back(&context->wallets,wallet);
    CWallet::ConnectScriptPubKeyManNotifiers
              ((wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::operator()(&((wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->NotifyCanGetAddressesChanged);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return _Var2._M_current == psVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddWallet(WalletContext& context, const std::shared_ptr<CWallet>& wallet)
{
    LOCK(context.wallets_mutex);
    assert(wallet);
    std::vector<std::shared_ptr<CWallet>>::const_iterator i = std::find(context.wallets.begin(), context.wallets.end(), wallet);
    if (i != context.wallets.end()) return false;
    context.wallets.push_back(wallet);
    wallet->ConnectScriptPubKeyManNotifiers();
    wallet->NotifyCanGetAddressesChanged();
    return true;
}